

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vta_ManProfileAddition(Vta_Man_t *p,Vec_Int_t *vTermsToAdd)

{
  int iVar1;
  void *pvVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int *pCounters;
  int i;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis;
  Vec_Int_t *vTermsToAdd_local;
  Vta_Man_t *p_local;
  
  pvVar2 = calloc((long)(p->pPars->iFrame + 1),4);
  pCounters._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vTermsToAdd);
    bVar4 = false;
    if (pCounters._4_4_ < iVar1) {
      iVar1 = Vec_IntEntry(vTermsToAdd,pCounters._4_4_);
      pObj = (Gia_Obj_t *)Vta_ManObj(p,iVar1);
      bVar4 = false;
      if ((Vta_Obj_t *)pObj != (Vta_Obj_t *)0x0) {
        pGVar3 = Gia_ManObj(p->pGia,((Vta_Obj_t *)pObj)->iObj);
        bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar4) break;
    *(int *)((long)pvVar2 + (long)*(int *)&pObj->field_0x4 * 4) =
         *(int *)((long)pvVar2 + (long)*(int *)&pObj->field_0x4 * 4) + 1;
    pCounters._4_4_ = pCounters._4_4_ + 1;
  }
  for (pCounters._4_4_ = 0; pCounters._4_4_ <= p->pPars->iFrame;
      pCounters._4_4_ = pCounters._4_4_ + 1) {
    Abc_Print(1,"%2d",(ulong)*(uint *)((long)pvVar2 + (long)pCounters._4_4_ * 4));
  }
  Abc_Print(1,"***\n");
  return;
}

Assistant:

void Vta_ManProfileAddition( Vta_Man_t * p, Vec_Int_t * vTermsToAdd )
{
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    // profile the added ones
    int i, * pCounters = ABC_CALLOC( int, p->pPars->iFrame+1 );
    Vta_ManForEachObjObjVec( vTermsToAdd, p, pThis, pObj, i )
        pCounters[pThis->iFrame]++;
    for ( i = 0; i <= p->pPars->iFrame; i++ )
        Abc_Print( 1, "%2d", pCounters[i] );
    Abc_Print( 1, "***\n" );
}